

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

void Addr_ESI_disp32(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  size_t sVar1;
  size_t i_00;
  long local_28;
  long MyNumber;
  size_t i;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  MyNumber = 0;
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    local_28 = (long)*(short *)((pMyDisasm->Reserved_).EIP_ + 2);
  }
  else {
    local_28 = (long)*(int *)((pMyDisasm->Reserved_).EIP_ + 2);
  }
  (pMyOperand->Memory).Displacement = local_28;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar1 = printDisp32(pMyOperand,0,pMyDisasm,local_28);
    strcpy(pMyOperand->OpMnemonic + sVar1,"(%");
    MyNumber = sVar1 + 2;
  }
  fillModrm0Register(pMyOperand,pMyDisasm,MyNumber,'\x06');
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    (pMyOperand->Memory).BaseRegister = REGS[5];
  }
  i_00 = strlen(pMyOperand->OpMnemonic);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic + i_00,")");
  }
  else {
    printDisp32(pMyOperand,i_00,pMyDisasm,local_28);
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_ESI_disp32(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    size_t i = 0;
    long MyNumber;
    if (GV.AddressSize == 16) {
        MyNumber = *((Int16*) (GV.EIP_+2));
    }
    else{
        MyNumber = *((Int32*) (GV.EIP_+2));
    }
    pMyOperand->Memory.Displacement = MyNumber;
    if (GV.SYNTAX_ == ATSyntax) {
      i = printDisp32(pMyOperand, i, pMyDisasm, MyNumber);
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(%");
      #endif
      i+=2;
    }
    fillModrm0Register(pMyOperand, pMyDisasm, i, 6);
    if (GV.AddressSize == 16) {
      pMyOperand->Memory.BaseRegister = REGS[5];
    }
    #ifndef BEA_LIGHT_DISASSEMBLY
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
        i += 1;
    }
    else {
      i = printDisp32(pMyOperand, i, pMyDisasm, MyNumber);
    }
    #endif
}